

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O0

void uint256_tests::TestFromHex<transaction_identifier<false>>(void)

{
  string_view hex;
  string_view hex_00;
  string_view hex_01;
  string_view hex_02;
  string_view hex_03;
  string_view hex_04;
  string_view hex_05;
  string_view hex_06;
  string_view hex_07;
  string_view hex_08;
  string_view hex_09;
  string_view hex_10;
  string_view str;
  string_view str_00;
  bool bVar1;
  lazy_ostream *plVar2;
  long in_FS_OFFSET;
  char c;
  string *__range2;
  uint num_chars;
  iterator __end2;
  iterator __begin2;
  string chars_68;
  string invalid_prefix;
  string invalid_chars;
  optional<transaction_identifier<false>_> valid_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid_input;
  string valid_64char_input;
  char *in_stack_fffffffffffff488;
  lazy_ostream *in_stack_fffffffffffff490;
  char *in_stack_fffffffffffff498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4b0;
  const_string *msg;
  lazy_ostream *in_stack_fffffffffffff4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4c0;
  const_string *pcVar3;
  allocator<char> *in_stack_fffffffffffff4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4d8;
  size_t in_stack_fffffffffffff4e0;
  char *in_stack_fffffffffffff4e8;
  const_string local_9c8 [2];
  lazy_ostream local_9a8 [3];
  assertion_result local_978 [2];
  const_string local_940 [2];
  lazy_ostream local_920 [3];
  assertion_result local_8f0 [3];
  undefined1 local_8a8 [16];
  undefined1 local_898 [64];
  const_string local_858 [2];
  lazy_ostream local_838 [2];
  assertion_result local_818 [2];
  const_string local_7e0 [2];
  lazy_ostream local_7c0 [3];
  assertion_result local_790 [2];
  const_string local_758 [2];
  lazy_ostream local_738 [2];
  assertion_result local_718 [2];
  char *local_6e0;
  char *local_6d8;
  allocator<char> local_6c9;
  const_string local_6c8 [2];
  lazy_ostream local_6a8 [2];
  assertion_result local_688 [2];
  const_string local_650 [2];
  lazy_ostream local_630 [2];
  assertion_result local_610 [2];
  const_string local_5d8 [2];
  lazy_ostream local_5b8 [2];
  assertion_result local_598 [2];
  const_string local_560 [2];
  lazy_ostream local_540 [3];
  assertion_result local_510 [2];
  const_string local_4d8 [2];
  lazy_ostream local_4b8 [3];
  assertion_result local_488 [2];
  undefined1 local_450 [16];
  undefined1 local_440 [64];
  const_string local_400 [2];
  lazy_ostream local_3e0 [2];
  assertion_result local_3c0 [2];
  allocator<char> local_383 [67];
  lazy_ostream local_340 [4];
  undefined1 local_2f8 [584];
  lazy_ostream local_b0 [2];
  undefined1 local_90 [136];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff4d8,(char *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
  std::allocator<char>::~allocator(local_383);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffff4b0,(size_type)in_stack_fffffffffffff4a8,
             (size_type)in_stack_fffffffffffff4a0);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
  hex._M_str = (char *)in_stack_fffffffffffff4b0;
  hex._M_len = (size_t)in_stack_fffffffffffff4a8;
  transaction_identifier<false>::FromHex(hex);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,
               (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
               (const_string *)in_stack_fffffffffffff4b0);
    boost::test_tools::assertion_result::
    assertion_result<std::optional<transaction_identifier<false>>>
              ((assertion_result *)in_stack_fffffffffffff498,
               (optional<transaction_identifier<false>_> *)in_stack_fffffffffffff490);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff488 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3c0,local_3e0,local_400,0x105,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,
               (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
               (const_string *)in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    std::optional<transaction_identifier<false>_>::operator->
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
    transaction_identifier<false>::ToString_abi_cxx11_
              ((transaction_identifier<false> *)in_stack_fffffffffffff490);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    str._M_str = in_stack_fffffffffffff4e8;
    str._M_len = in_stack_fffffffffffff4e0;
    ToLower_abi_cxx11_(str);
    in_stack_fffffffffffff498 = "ToLower(valid_input)";
    in_stack_fffffffffffff490 = local_b0;
    in_stack_fffffffffffff488 = "valid_result->ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_440,local_450,0x106,1,2,local_90);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,
               (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
               (const_string *)in_stack_fffffffffffff4b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    hex_00._M_str = (char *)in_stack_fffffffffffff4b0;
    hex_00._M_len = (size_t)in_stack_fffffffffffff4a8;
    transaction_identifier<false>::FromHex(hex_00);
    std::optional::operator_cast_to_bool
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff498,
               SUB81((ulong)in_stack_fffffffffffff490 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff488 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_488,local_4b8,local_4d8,0x10a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,
               (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
               (const_string *)in_stack_fffffffffffff4b0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    hex_01._M_str = (char *)in_stack_fffffffffffff4b0;
    hex_01._M_len = (size_t)in_stack_fffffffffffff4a8;
    transaction_identifier<false>::FromHex(hex_01);
    std::optional::operator_cast_to_bool
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff498,
               SUB81((ulong)in_stack_fffffffffffff490 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff488 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_510,local_540,local_560,0x10b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,
               (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
               (const_string *)in_stack_fffffffffffff4b0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffff4b0,(size_type)in_stack_fffffffffffff4a8,
               (size_type)in_stack_fffffffffffff4a0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    hex_02._M_str = (char *)in_stack_fffffffffffff4b0;
    hex_02._M_len = (size_t)in_stack_fffffffffffff4a8;
    transaction_identifier<false>::FromHex(hex_02);
    std::optional::operator_cast_to_bool
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff498,
               SUB81((ulong)in_stack_fffffffffffff490 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff488 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_598,local_5b8,local_5d8,0x10c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff488);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,
               (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
               (const_string *)in_stack_fffffffffffff4b0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffff4b0,(size_type)in_stack_fffffffffffff4a8,
               (size_type)in_stack_fffffffffffff4a0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    hex_03._M_str = (char *)in_stack_fffffffffffff4b0;
    hex_03._M_len = (size_t)in_stack_fffffffffffff4a8;
    transaction_identifier<false>::FromHex(hex_03);
    std::optional::operator_cast_to_bool
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff498,
               SUB81((ulong)in_stack_fffffffffffff490 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff488 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_610,local_630,local_650,0x10d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff488);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,
               (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
               (const_string *)in_stack_fffffffffffff4b0);
    std::operator+(in_stack_fffffffffffff4c0,(char *)in_stack_fffffffffffff4b8);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    hex_04._M_str = (char *)in_stack_fffffffffffff4b0;
    hex_04._M_len = (size_t)in_stack_fffffffffffff4a8;
    transaction_identifier<false>::FromHex(hex_04);
    std::optional::operator_cast_to_bool
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff498,
               SUB81((ulong)in_stack_fffffffffffff490 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff488 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_688,local_6a8,local_6c8,0x10e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff488);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff4d8,(char *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
  std::allocator<char>::~allocator(&local_6c9);
  local_6d8 = (char *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff488);
  local_6e0 = (char *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff498);
  while (bVar1 = __gnu_cxx::
                 operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffff498,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffff490), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff488);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
                 (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff4c8,
                 (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
                 (const_string *)in_stack_fffffffffffff4b0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffff4b0,(size_type)in_stack_fffffffffffff4a8,
                 (size_type)in_stack_fffffffffffff4a0);
      std::operator+(in_stack_fffffffffffff4a0,(char)((ulong)in_stack_fffffffffffff498 >> 0x38));
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
      hex_05._M_str = (char *)in_stack_fffffffffffff4b0;
      hex_05._M_len = (size_t)in_stack_fffffffffffff4a8;
      transaction_identifier<false>::FromHex(hex_05);
      std::optional::operator_cast_to_bool
                ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff498,
                 SUB81((ulong)in_stack_fffffffffffff490 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
                 (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
      boost::unit_test::operator<<
                (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
                 (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
      in_stack_fffffffffffff488 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_718,local_738,local_758,0x114,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff488);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff488);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff488);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff488);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff488);
  }
  std::operator+((char *)in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,
               (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
               (const_string *)in_stack_fffffffffffff4b0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff498,
               (char *)in_stack_fffffffffffff490,(size_type)in_stack_fffffffffffff488);
    hex_06._M_str = (char *)in_stack_fffffffffffff4b0;
    hex_06._M_len = (size_t)in_stack_fffffffffffff4a8;
    transaction_identifier<false>::FromHex(hex_06);
    std::optional::operator_cast_to_bool
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff498,
               SUB81((ulong)in_stack_fffffffffffff490 >> 0x38,0));
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff488 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_790,local_7c0,local_7e0,0x118,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pcVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,
               (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
               (const_string *)in_stack_fffffffffffff4b0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    hex_07._M_str = (char *)in_stack_fffffffffffff4b0;
    hex_07._M_len = (size_t)in_stack_fffffffffffff4a8;
    transaction_identifier<false>::FromHex(hex_07);
    std::optional::operator_cast_to_bool
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff498,
               SUB81((ulong)in_stack_fffffffffffff490 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff488 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_818,local_838,local_858,0x119,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff488);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff488);
  std::operator+(in_stack_fffffffffffff4c0,(char *)in_stack_fffffffffffff4b8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,
               (const_string *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8,
               (const_string *)in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff498,
               (char *)in_stack_fffffffffffff490,(size_type)in_stack_fffffffffffff488);
    hex_08._M_str = (char *)in_stack_fffffffffffff4b0;
    hex_08._M_len = (size_t)in_stack_fffffffffffff4a8;
    transaction_identifier<false>::FromHex(hex_08);
    in_stack_fffffffffffff4c8 =
         (allocator<char> *)
         std::optional<transaction_identifier<false>_>::value
                   ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff498);
    transaction_identifier<false>::ToString_abi_cxx11_
              ((transaction_identifier<false> *)in_stack_fffffffffffff490);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    str_00._M_str = (char *)plVar2;
    str_00._M_len = (size_t)pcVar3;
    ToLower_abi_cxx11_(str_00);
    in_stack_fffffffffffff498 = "ToLower(valid_input)";
    in_stack_fffffffffffff490 = local_340;
    in_stack_fffffffffffff488 =
         "T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_898,local_8a8,0x11e,1,2,local_2f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pcVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,pcVar3,(size_t)in_stack_fffffffffffff4b8
               ,(const_string *)in_stack_fffffffffffff4b0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff498,
               (char *)in_stack_fffffffffffff490,(size_type)in_stack_fffffffffffff488);
    hex_09._M_str = (char *)in_stack_fffffffffffff4b0;
    hex_09._M_len = (size_t)in_stack_fffffffffffff4a8;
    transaction_identifier<false>::FromHex(hex_09);
    std::optional::operator_cast_to_bool
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff498,
               SUB81((ulong)in_stack_fffffffffffff490 >> 0x38,0));
    in_stack_fffffffffffff4b8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff488 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8f0,local_920,local_940,0x11f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4c8,pcVar3,(size_t)in_stack_fffffffffffff4b8
               ,msg);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff498,
               (char *)in_stack_fffffffffffff490,(size_type)in_stack_fffffffffffff488);
    hex_10._M_str = (char *)msg;
    hex_10._M_len = (size_t)in_stack_fffffffffffff4a8;
    transaction_identifier<false>::FromHex(hex_10);
    std::optional::operator_cast_to_bool
              ((optional<transaction_identifier<false>_> *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff498,
               SUB81((ulong)in_stack_fffffffffffff490 >> 0x38,0));
    in_stack_fffffffffffff4a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff490,(basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,
               (pointer)in_stack_fffffffffffff490,(unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff488 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_978,local_9a8,local_9c8,0x120,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff488);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff488);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff488);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff488);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestFromHex()
{
    constexpr unsigned int num_chars{T::size() * 2};
    static_assert(num_chars <= 64); // this test needs to be modified to allow for more than 64 hex chars
    const std::string valid_64char_input{"0123456789abcdef0123456789ABCDEF0123456789abcdef0123456789ABCDEF"};
    const auto valid_input{valid_64char_input.substr(0, num_chars)};
    {
        // check that lower and upper case hex characters are accepted
        auto valid_result{T::FromHex(valid_input)};
        BOOST_REQUIRE(valid_result);
        BOOST_CHECK_EQUAL(valid_result->ToString(), ToLower(valid_input));
    }
    {
        // check that only strings of size num_chars are accepted
        BOOST_CHECK(!T::FromHex(""));
        BOOST_CHECK(!T::FromHex("0"));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars / 2)));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1)));
        BOOST_CHECK(!T::FromHex(valid_input + "0"));
    }
    {
        // check that non-hex characters are not accepted
        std::string invalid_chars{R"( !"#$%&'()*+,-./:;<=>?@GHIJKLMNOPQRSTUVWXYZ[\]^_`ghijklmnopqrstuvwxyz{|}~)"};
        for (auto c : invalid_chars) {
            BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1) + c));
        }
        // 0x prefixes are invalid
        std::string invalid_prefix{"0x" + valid_input};
        BOOST_CHECK(!T::FromHex(std::string_view(invalid_prefix.data(), num_chars)));
        BOOST_CHECK(!T::FromHex(invalid_prefix));
    }
    {
        // check that string_view length is respected
        std::string chars_68{valid_64char_input + "0123"};
        BOOST_CHECK_EQUAL(T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString(), ToLower(valid_input));
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))); // too short
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))); // too long
    }
}